

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
SwapFallback<google::protobuf::RepeatedPtrField<google::protobuf::Message>::TypeHandler>
          (RepeatedPtrFieldBase *this,RepeatedPtrFieldBase *other)

{
  Arena *pAVar1;
  Arena *pAVar2;
  LogMessage *other_00;
  undefined1 local_80 [8];
  RepeatedPtrFieldBase temp;
  LogMessage local_50;
  RepeatedPtrFieldBase *local_18;
  RepeatedPtrFieldBase *other_local;
  RepeatedPtrFieldBase *this_local;
  
  local_18 = other;
  other_local = this;
  pAVar1 = GetArenaNoVirtual(other);
  pAVar2 = GetArenaNoVirtual(this);
  if (pAVar1 == pAVar2) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ac);
    other_00 = LogMessage::operator<<
                         (&local_50,
                          "CHECK failed: other->GetArenaNoVirtual() != GetArenaNoVirtual(): ");
    LogFinisher::operator=((LogFinisher *)((long)&temp.rep_ + 3),other_00);
    LogMessage::~LogMessage(&local_50);
  }
  pAVar1 = GetArenaNoVirtual(local_18);
  RepeatedPtrFieldBase((RepeatedPtrFieldBase *)local_80,pAVar1);
  MergeFrom<google::protobuf::RepeatedPtrField<google::protobuf::Message>::TypeHandler>
            ((RepeatedPtrFieldBase *)local_80,this);
  Clear<google::protobuf::RepeatedPtrField<google::protobuf::Message>::TypeHandler>(this);
  MergeFrom<google::protobuf::RepeatedPtrField<google::protobuf::Message>::TypeHandler>
            (this,local_18);
  Clear<google::protobuf::RepeatedPtrField<google::protobuf::Message>::TypeHandler>(local_18);
  InternalSwap(local_18,(RepeatedPtrFieldBase *)local_80);
  Destroy<google::protobuf::RepeatedPtrField<google::protobuf::Message>::TypeHandler>
            ((RepeatedPtrFieldBase *)local_80);
  ~RepeatedPtrFieldBase((RepeatedPtrFieldBase *)local_80);
  return;
}

Assistant:

void RepeatedPtrFieldBase::SwapFallback(RepeatedPtrFieldBase* other) {
  GOOGLE_DCHECK(other->GetArenaNoVirtual() != GetArenaNoVirtual());

  // Copy semantics in this case. We try to improve efficiency by placing the
  // temporary on |other|'s arena so that messages are copied cross-arena only
  // once, not twice.
  RepeatedPtrFieldBase temp(other->GetArenaNoVirtual());
  temp.MergeFrom<TypeHandler>(*this);
  this->Clear<TypeHandler>();
  this->MergeFrom<TypeHandler>(*other);
  other->Clear<TypeHandler>();
  other->InternalSwap(&temp);
  temp.Destroy<TypeHandler>();  // Frees rep_ if `other` had no arena.
}